

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O2

aiVector3t<float>
Assimp::FBX::PropertyGet<aiVector3t<float>>
          (PropertyTable *in,string *name,bool *result,bool useTemplate)

{
  PropertyTable *this;
  Property *this_00;
  TypedProperty<aiVector3t<float>_> *pTVar1;
  undefined8 uVar2;
  float fVar3;
  aiVector3t<float> aVar4;
  
  this_00 = PropertyTable::Get(in,name);
  if (this_00 == (Property *)0x0) {
    if ((useTemplate) &&
       (this = (in->templateProps).
               super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, this != (PropertyTable *)0x0)) {
      this_00 = PropertyTable::Get(this,name);
      if (this_00 != (Property *)0x0) goto LAB_00502d67;
    }
  }
  else {
LAB_00502d67:
    pTVar1 = Property::As<Assimp::FBX::TypedProperty<aiVector3t<float>>>(this_00);
    if (pTVar1 != (TypedProperty<aiVector3t<float>_> *)0x0) {
      *result = true;
      uVar2._0_4_ = (pTVar1->value).x;
      uVar2._4_4_ = (pTVar1->value).y;
      fVar3 = (pTVar1->value).z;
      goto LAB_00502da7;
    }
  }
  *result = false;
  uVar2 = 0;
  fVar3 = 0.0;
LAB_00502da7:
  aVar4.z = fVar3;
  aVar4.x = (float)(int)uVar2;
  aVar4.y = (float)(int)((ulong)uVar2 >> 0x20);
  return aVar4;
}

Assistant:

inline 
T PropertyGet(const PropertyTable& in, const std::string& name, bool& result, bool useTemplate=false ) {
    const Property* prop = in.Get(name);
    if( nullptr == prop) {
        if ( ! useTemplate ) {
            result = false;
            return T();
        }
        const PropertyTable* templ = in.TemplateProps();
        if ( nullptr == templ ) {
            result = false;
            return T();
        }
        prop = templ->Get(name);
        if ( nullptr == prop ) {
            result = false;
            return T();
        }
    }

    // strong typing, no need to be lenient
    const TypedProperty<T>* const tprop = prop->As< TypedProperty<T> >();
    if( nullptr == tprop) {
        result = false;
        return T();
    }

    result = true;
    return tprop->Value();
}